

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructRMW(InternalAnalyzer *this,StructRMW *curr)

{
  EffectAnalyzer *pEVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = wasm::Type::isNull(&curr->ref->type);
  pEVar1 = this->parent;
  if (bVar3) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->readsMutableStruct = true;
    pEVar1->writesStruct = true;
    uVar2 = (curr->ref->type).id;
    if (((uint)uVar2 & 3) == 2 && 6 < uVar2) {
      pEVar1->implicitTrap = true;
    }
    if (curr->order == Unordered) {
      __assert_fail("curr->order != MemoryOrder::Unordered",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x390,
                    "void wasm::EffectAnalyzer::InternalAnalyzer::visitStructRMW(StructRMW *)");
    }
    pEVar1->isAtomic = true;
  }
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsMutableStruct = true;
      parent.writesStruct = true;
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      assert(curr->order != MemoryOrder::Unordered);
      parent.isAtomic = true;
    }